

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

void __thiscall cmListFileBacktrace::PrintCallStack(cmListFileBacktrace *this,ostream *out)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  Snapshot *this_00;
  cmListFileContext lfc;
  string commandName;
  Snapshot parent;
  cmOutputConverter converter;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long local_d0;
  undefined1 local_c8 [32];
  string local_a8;
  string local_88;
  Snapshot local_68;
  cmOutputConverter local_50;
  
  this_00 = &this->Snapshot;
  bVar2 = cmState::Snapshot::IsValid(this_00);
  if (bVar2) {
    cmState::Snapshot::GetCallStackParent(&local_68,this_00);
    bVar2 = cmState::Snapshot::IsValid(&local_68);
    if (bVar2) {
      cmState::Snapshot::GetExecutionListFile_abi_cxx11_((string *)local_110,&local_68);
      uVar1 = local_110._8_8_;
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
      }
      if (uVar1 != 0) {
        cmOutputConverter::cmOutputConverter(&local_50,*this_00);
        cmState::Snapshot::GetEntryPointCommand_abi_cxx11_(&local_88,this_00);
        lVar3 = cmState::Snapshot::GetEntryPointLine(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,"Call Stack (most recent call first):\n",0x25);
        while( true ) {
          bVar2 = cmState::Snapshot::IsValid(&local_68);
          if (!bVar2) break;
          local_110._0_8_ = local_110 + 0x10;
          local_110._8_8_ = 0;
          local_110[0x10] = '\0';
          local_f0._M_p = (pointer)&local_e0;
          local_e8 = 0;
          local_e0._M_local_buf[0] = '\0';
          local_d0 = 0;
          std::__cxx11::string::_M_assign((string *)local_110);
          local_d0 = lVar3;
          cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_a8,&local_68);
          cmOutputConverter::Convert((string *)local_c8,&local_50,&local_a8,HOME,UNCHANGED);
          std::__cxx11::string::operator=((string *)&local_f0,(string *)local_c8);
          if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
          operator<<(out,(cmListFileContext *)local_110);
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
          cmState::Snapshot::GetEntryPointCommand_abi_cxx11_((string *)local_c8,&local_68);
          std::__cxx11::string::operator=((string *)&local_88,(string *)local_c8);
          if ((cmState *)local_c8._0_8_ != (cmState *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
          lVar3 = cmState::Snapshot::GetEntryPointLine(&local_68);
          cmState::Snapshot::GetCallStackParent((Snapshot *)local_c8,&local_68);
          local_68.Position.Position = local_c8._16_8_;
          local_68.State = (cmState *)local_c8._0_8_;
          local_68.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_c8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_p != &local_e0) {
            operator_delete(local_f0._M_p,
                            CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0])
                            + 1);
          }
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintCallStack(std::ostream& out) const
{
  if (!this->Snapshot.IsValid())
    {
    return;
    }
  cmState::Snapshot parent = this->Snapshot.GetCallStackParent();
  if (!parent.IsValid() || parent.GetExecutionListFile().empty())
    {
    return;
    }

  cmOutputConverter converter(this->Snapshot);
  std::string commandName = this->Snapshot.GetEntryPointCommand();
  long commandLine = this->Snapshot.GetEntryPointLine();

  out << "Call Stack (most recent call first):\n";
  while(parent.IsValid())
    {
    cmListFileContext lfc;
    lfc.Name = commandName;
    lfc.Line = commandLine;

    lfc.FilePath = converter.Convert(parent.GetExecutionListFile(),
                                     cmOutputConverter::HOME);
    out << "  " << lfc << "\n";

    commandName = parent.GetEntryPointCommand();
    commandLine = parent.GetEntryPointLine();
    parent = parent.GetCallStackParent();
    }
}